

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeModuleGetProperties(ze_module_handle_t hModule,ze_module_properties_t *pModuleProperties)

{
  ze_pfnModuleGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  ze_module_properties_t *pModuleProperties_local;
  ze_module_handle_t hModule_local;
  
  if (*(code **)(*(long *)(hModule + 8) + 0x528) == (code *)0x0) {
    hModule_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hModule_local._4_4_ =
         (**(code **)(*(long *)(hModule + 8) + 0x528))(*(undefined8 *)hModule,pModuleProperties);
  }
  return hModule_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeModuleGetProperties(
        ze_module_handle_t hModule,                     ///< [in] handle of the module
        ze_module_properties_t* pModuleProperties       ///< [in,out] query result for module properties.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_module_object_t*>( hModule )->dditable;
        auto pfnGetProperties = dditable->ze.Module.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hModule = reinterpret_cast<ze_module_object_t*>( hModule )->handle;

        // forward to device-driver
        result = pfnGetProperties( hModule, pModuleProperties );

        return result;
    }